

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O3

void __thiscall
arangodb::velocypack::Validator::validateObject(Validator *this,uint8_t *ptr,size_t length)

{
  byte *ptr_00;
  byte bVar1;
  uint uVar2;
  byte bVar3;
  ValueLength VVar4;
  int64_t iVar5;
  ValueLength length_00;
  ulong uVar6;
  undefined1 *puVar7;
  ulong uVar8;
  iterator __it;
  Exception *pEVar9;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *puVar10;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *puVar11;
  char *pcVar12;
  byte *ptr_01;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong *puVar16;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *puVar17;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *ptr_02;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *puVar18;
  byte *pbVar19;
  long lVar20;
  bool bVar21;
  undefined1 *puStack_108;
  _Head_base<0UL,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_*,_false>
  _Stack_f8;
  ulong uStack_f0;
  _Head_base<0UL,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_*,_false>
  _Stack_e8;
  long lStack_e0;
  ulong uStack_d8;
  Validator *pVStack_d0;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *puStack_c8;
  long lStack_c0;
  undefined1 auStack_b8 [88];
  undefined8 uStack_60;
  Validator *pVStack_50;
  byte *pbStack_48;
  byte *pbStack_40;
  byte *pbStack_38;
  
  if (*ptr == '\x14') {
    uStack_60 = 0x114ec8;
    pVStack_50 = this;
    validateBufferLength(this,5,length,true);
    pbStack_40 = ptr + 1;
    uStack_60 = 0x114ee0;
    VVar4 = ReadVariableLengthValue<false>(&pbStack_40,ptr + length + 1);
    ptr_01 = pbStack_40;
    if ((VVar4 <= length) && (4 < VVar4)) {
      pbStack_40 = ptr + (VVar4 - 1);
      uStack_60 = 0x114f0d;
      VVar4 = ReadVariableLengthValue<true>(&pbStack_40,ptr + VVar4);
      if (VVar4 != 0) {
        pbVar19 = pbStack_40 + 1;
        pbStack_40 = ptr_01;
        do {
          if (pbVar19 <= ptr_01) {
            uStack_60 = 0x115055;
            pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
            pcVar12 = "Object items number is out of bounds";
            goto LAB_00115075;
          }
          uStack_60 = 0x114f4e;
          validatePart(pVStack_50,ptr_01,(long)pbVar19 - (long)ptr_01,true);
          bVar1 = *ptr_01;
          uVar8 = (ulong)bVar1;
          uVar6 = uVar8 - 0x40;
          pbStack_48 = ptr_01;
          if (0x7f < uVar6) {
            if ((bVar1 & 0xf0) == 0x30) {
              uStack_60 = 0x114f7e;
              iVar5 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                      getSmallInt((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)&pbStack_48);
              if (iVar5 < 1) {
LAB_00115061:
                uStack_60 = 0x11506b;
                pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
                pcVar12 = "Invalid object key type";
                goto LAB_00115075;
              }
              uVar8 = (ulong)*pbStack_48;
            }
            else if ((bVar1 & 0xf8) != 0x28) goto LAB_00115061;
          }
          length_00 = (ValueLength)"\x01\x01"[uVar8];
          if (length_00 == 0) {
            uStack_60 = 0x114fb9;
            length_00 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                        byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                         *)&pbStack_48,pbStack_48);
          }
          if ((uVar6 < 0x80) && (pVStack_50->options->validateUtf8Strings == true)) {
            uStack_60 = 0x114fe0;
            validatePart(pVStack_50,ptr_01,length_00,true);
          }
          ptr_00 = ptr_01 + length_00;
          uStack_60 = 0x114ffc;
          validatePart(pVStack_50,ptr_00,(long)pbVar19 - (long)ptr_00,true);
          uVar6 = (ulong)"\x01\x01"[ptr_01[length_00]];
          pbStack_38 = ptr_00;
          if (uVar6 == 0) {
            uStack_60 = 0x115020;
            uVar6 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                    byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                     *)&pbStack_38,ptr_00);
          }
          VVar4 = VVar4 - 1;
          ptr_01 = ptr_00 + uVar6;
        } while (VVar4 != 0);
        if (ptr_01 == pbVar19) {
          return;
        }
        uStack_60 = 0x1150b8;
        pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar12 = "Object has more members than specified";
        goto LAB_00115075;
      }
    }
    uStack_60 = 0x1150a2;
    pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
    pcVar12 = "Object length value is out of bounds";
LAB_00115075:
    uStack_60 = 0x115082;
    Exception::Exception(pEVar9,ValidatorInvalidLength,pcVar12);
    uStack_60 = 0x115098;
    __cxa_throw(pEVar9,&Exception::typeinfo,Exception::~Exception);
  }
  if (7 < (byte)(*ptr - 0xb)) {
    return;
  }
  bVar1 = *ptr;
  lVar15 = ((ulong)((ulong)bVar1 < 0xf) << 2 | 0xfffffffffffffff1) + (ulong)bVar1;
  bVar3 = (byte)lVar15;
  lVar20 = 1L << (bVar3 & 0x3f);
  pVStack_d0 = this;
  validateBufferLength(this,(2L << (bVar3 & 0x3f)) + 2,length,true);
  puVar16 = (ulong *)(ptr + 1);
  uStack_d8 = lVar20 - 1;
  lStack_e0 = lVar15;
  switch(uStack_d8) {
  case 0:
    uVar6 = (ulong)(byte)*puVar16;
    break;
  case 1:
    uVar6 = (ulong)(ushort)*puVar16;
    break;
  case 2:
    uVar8 = (ulong)ptr[1];
    uVar6 = (ulong)*(ushort *)(ptr + 2) << 8;
    goto LAB_00115193;
  case 3:
    uVar6 = (ulong)*(uint *)(ptr + 1);
    break;
  case 4:
    uVar2 = (uint)*puVar16;
    uVar6 = (ulong)ptr[5];
    goto LAB_0011518f;
  case 5:
    uVar2 = (uint)*puVar16;
    uVar6 = (ulong)*(ushort *)(ptr + 5);
LAB_0011518f:
    uVar8 = (ulong)uVar2;
    uVar6 = uVar6 << 0x20;
LAB_00115193:
    uVar6 = uVar6 | uVar8;
    break;
  case 6:
    uVar6 = (ulong)(uint7)*puVar16;
    break;
  case 7:
    uVar6 = *puVar16;
    break;
  default:
    uVar6 = 0;
    goto LAB_001151bd;
  }
  if (length < uVar6) {
    pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
    pcVar12 = "Object length is out of bounds";
    goto LAB_0011591f;
  }
LAB_001151bd:
  if ((bVar1 != 0x12) && (bVar1 != 0xe)) {
    if (7 < uStack_d8) goto LAB_001158a8;
    puVar16 = (ulong *)((long)puVar16 + lVar20);
    switch(uStack_d8) {
    case 0:
      uVar8 = (ulong)(byte)*puVar16;
      break;
    case 1:
      uVar8 = (ulong)(ushort)*puVar16;
      break;
    case 2:
      uVar14 = (ulong)(byte)*puVar16;
      uVar8 = (ulong)*(ushort *)((long)puVar16 + 1) << 8;
      goto LAB_001152ea;
    case 3:
      uVar8 = (ulong)(uint)*puVar16;
      break;
    case 4:
      uVar2 = (uint)*puVar16;
      uVar8 = (ulong)*(byte *)((long)puVar16 + 4);
      goto LAB_001152e6;
    case 5:
      uVar2 = (uint)*puVar16;
      uVar8 = (ulong)*(ushort *)((long)puVar16 + 4);
LAB_001152e6:
      uVar14 = (ulong)uVar2;
      uVar8 = uVar8 << 0x20;
LAB_001152ea:
      uVar8 = uVar8 | uVar14;
      break;
    case 6:
      uVar8 = (ulong)(uint7)*puVar16;
      break;
    case 7:
      uVar8 = *puVar16;
    }
    if (uVar8 == 0) goto LAB_001158a8;
    ptr_02 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)((long)puVar16 + lVar20);
    puVar10 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *)((long)&(ptr_02->_M_h)._M_bucket_count + (-2L << (bVar3 & 0x3f)));
    puVar17 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *)(ptr + uVar6);
    puVar11 = puVar10;
    if (puVar17 < puVar10) {
      puVar11 = puVar17;
    }
    puVar18 = ptr_02;
    if (ptr_02 < puVar11) {
      do {
        if (*(byte *)&(puVar18->_M_h)._M_buckets != 0) break;
        puVar18 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)((long)&(puVar18->_M_h)._M_buckets + 1);
      } while (puVar18 < puVar11);
      bVar21 = puVar18 != ptr_02;
      ptr_02 = puVar18;
      if ((bVar21) && (puVar18 != puVar10)) {
        pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar12 = "Object padding is invalid";
        goto LAB_0011591f;
      }
    }
    puVar17 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *)((long)puVar17 - (uVar8 << (bVar3 & 0x3f)));
    if (((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *)(ptr + lVar20 * 2) <= puVar17) && (ptr_02 <= puVar17)) {
      lVar20 = -lVar20;
      goto LAB_001153aa;
    }
    goto LAB_001158be;
  }
  if (7 < uStack_d8) goto LAB_001158a8;
  ptr_02 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            *)(ptr + uVar6);
  puVar16 = (ulong *)((long)ptr_02 - lVar20);
  switch(uStack_d8) {
  case 0:
    uVar8 = (ulong)(byte)*puVar16;
    break;
  case 1:
    uVar8 = (ulong)(ushort)*puVar16;
    break;
  case 2:
    uVar6 = (ulong)(byte)*puVar16;
    uVar8 = (ulong)*(ushort *)((long)puVar16 + 1) << 8;
    goto LAB_00115262;
  case 3:
    uVar8 = (ulong)(uint)*puVar16;
    break;
  case 4:
    uVar2 = (uint)*puVar16;
    uVar8 = (ulong)*(byte *)((long)puVar16 + 4);
    goto LAB_0011525e;
  case 5:
    uVar2 = (uint)*puVar16;
    uVar8 = (ulong)*(ushort *)((long)puVar16 + 4);
LAB_0011525e:
    uVar6 = (ulong)uVar2;
    uVar8 = uVar8 << 0x20;
LAB_00115262:
    uVar8 = uVar8 | uVar6;
    break;
  case 6:
    uVar8 = (ulong)(uint7)*puVar16;
    break;
  case 7:
    uVar8 = *puVar16;
  }
  if (uVar8 == 0) {
LAB_001158a8:
    pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
    pcVar12 = "Object nrItems value is invalid";
  }
  else {
    puVar17 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *)((long)puVar16 - (uVar8 << (bVar3 & 0x3f)));
    if ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         *)(ptr + lVar20) <= puVar17) {
      lVar20 = lVar20 * -2;
LAB_001153aa:
      if (puVar17 <=
          (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           *)(ptr + lVar20 + length)) {
        _Stack_f8._M_head_impl =
             (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)0x0;
        puVar7 = auStack_b8;
        if (0x10 < uVar8) {
          if (uVar8 < 0x81) {
            puVar7 = (undefined1 *)operator_new__(uVar8 * 8);
            puStack_108 = puVar7;
            goto LAB_00115436;
          }
          _Stack_f8._M_head_impl =
               (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)operator_new(0x38);
          *(undefined8 *)
           &((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)_Stack_f8._M_head_impl)->_M_rehash_policy = 0;
          (((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)_Stack_f8._M_head_impl)->_M_rehash_policy)._M_next_resize = 0;
          ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)_Stack_f8._M_head_impl)->_M_buckets =
               &((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)_Stack_f8._M_head_impl)->_M_single_bucket;
          ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)_Stack_f8._M_head_impl)->_M_bucket_count = 1;
          (((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)_Stack_f8._M_head_impl)->_M_before_begin)._M_nxt = (_Hash_node_base *)0x0;
          ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)_Stack_f8._M_head_impl)->_M_element_count = 0;
          (((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)_Stack_f8._M_head_impl)->_M_rehash_policy)._M_max_load_factor = 1.0;
          (((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)_Stack_f8._M_head_impl)->_M_rehash_policy)._M_next_resize = 0;
          ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)_Stack_f8._M_head_impl)->_M_single_bucket = (__node_base_ptr)0x0;
          _Stack_e8._M_head_impl =
               (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)0x0;
          std::
          unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
          ::~unique_ptr((unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                         *)&_Stack_e8);
        }
        puStack_108 = (undefined1 *)0x0;
LAB_00115436:
        uVar6 = 0;
        uStack_f0 = uVar8;
        for (; ptr_02 < puVar17;
            ptr_02 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)((long)&(ptr_02->_M_h)._M_buckets + uVar8 + VVar4)) {
          validatePart(pVStack_d0,(uint8_t *)ptr_02,(long)puVar17 - (long)ptr_02,true);
          bVar1 = *(byte *)&(ptr_02->_M_h)._M_buckets;
          uVar14 = (ulong)bVar1;
          uVar8 = uVar14 - 0x40;
          _Stack_e8._M_head_impl = ptr_02;
          if (0x7f < uVar8) {
            if ((bVar1 & 0xf0) == 0x30) {
              iVar5 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                      getSmallInt((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)&_Stack_e8);
              if (iVar5 < 1) {
LAB_0011586f:
                pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
                Exception::Exception(pEVar9,ValidatorInvalidLength,"Invalid object key type");
                __cxa_throw(pEVar9,&Exception::typeinfo,Exception::~Exception);
              }
              uVar14 = (ulong)*(byte *)&((_Stack_e8._M_head_impl)->_M_h)._M_buckets;
            }
            else if ((bVar1 & 0xf8) != 0x28) goto LAB_0011586f;
          }
          VVar4 = (ValueLength)"\x01\x01"[uVar14];
          if (VVar4 == 0) {
            VVar4 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                    byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                     *)&_Stack_e8,(uint8_t *)_Stack_e8._M_head_impl);
          }
          if ((uVar8 < 0x80) && (pVStack_d0->options->validateUtf8Strings == true)) {
            validatePart(pVStack_d0,(uint8_t *)ptr_02,VVar4,true);
          }
          puVar11 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)((long)&(ptr_02->_M_h)._M_buckets + VVar4);
          if (puVar17 <= puVar11) {
            pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
            Exception::Exception
                      (pEVar9,ValidatorInvalidLength,"Object value leaking into index table");
            __cxa_throw(pEVar9,&Exception::typeinfo,Exception::~Exception);
          }
          validatePart(pVStack_d0,(uint8_t *)puVar11,(long)puVar17 - (long)puVar11,true);
          lStack_c0 = (long)ptr_02 - (long)ptr;
          if (uStack_f0 < 0x81) {
            *(long *)(puVar7 + uVar6 * 8) = lStack_c0;
          }
          else {
            std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::_M_emplace<unsigned_long&>
                      ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)_Stack_f8._M_head_impl,&lStack_c0);
          }
          uVar8 = (ulong)"\x01\x01"[*(byte *)&(puVar11->_M_h)._M_buckets];
          puStack_c8 = puVar11;
          if (uVar8 == 0) {
            uVar8 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                    byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                     *)&puStack_c8,(uint8_t *)puVar11);
          }
          uVar6 = uVar6 + 1;
          if (uStack_f0 < uVar6) {
            pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
            Exception::Exception
                      (pEVar9,ValidatorInvalidLength,
                       "Object value has more key/value pairs than announced");
            __cxa_throw(pEVar9,&Exception::typeinfo,Exception::~Exception);
          }
        }
        if (uVar6 < uStack_f0) {
          pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
          Exception::Exception(pEVar9,ValidatorInvalidLength,"Object has fewer items than in index")
          ;
          __cxa_throw(pEVar9,&Exception::typeinfo,Exception::~Exception);
        }
        bVar1 = (byte)lStack_e0;
        if (uStack_f0 < 0x81) {
          lVar20 = 0;
          do {
            lVar15 = lVar20 << (bVar1 & 0x3f);
            switch(uStack_d8) {
            case 0:
              uVar6 = (ulong)*(byte *)((long)&(puVar17->_M_h)._M_buckets + lVar15);
              break;
            case 1:
              uVar6 = (ulong)*(ushort *)((long)&(puVar17->_M_h)._M_buckets + lVar15);
              break;
            case 2:
              uVar8 = (ulong)*(byte *)((long)&(puVar17->_M_h)._M_buckets + lVar15);
              uVar6 = (ulong)*(ushort *)((long)&(puVar17->_M_h)._M_buckets + lVar15 + 1) << 8;
              goto LAB_00115641;
            case 3:
              uVar6 = (ulong)*(uint *)((long)&(puVar17->_M_h)._M_buckets + lVar15);
              break;
            case 4:
              uVar2 = *(uint *)((long)&(puVar17->_M_h)._M_buckets + lVar15);
              uVar6 = (ulong)*(byte *)((long)&(puVar17->_M_h)._M_buckets + lVar15 + 4);
              goto LAB_00115620;
            case 5:
              uVar2 = *(uint *)((long)&(puVar17->_M_h)._M_buckets + lVar15);
              uVar6 = (ulong)*(ushort *)((long)&(puVar17->_M_h)._M_buckets + lVar15 + 4);
LAB_00115620:
              uVar8 = (ulong)uVar2;
              uVar6 = uVar6 << 0x20;
              goto LAB_00115641;
            case 6:
              uVar8 = (ulong)CONCAT12(*(byte *)((long)&(puVar17->_M_h)._M_buckets + lVar15 + 6),
                                      *(undefined2 *)
                                       ((long)&(puVar17->_M_h)._M_buckets + lVar15 + 4)) << 0x20;
              uVar6 = (ulong)*(uint *)((long)&(puVar17->_M_h)._M_buckets + lVar15);
LAB_00115641:
              uVar6 = uVar6 | uVar8;
              break;
            case 7:
              uVar6 = *(ulong *)((long)&(puVar17->_M_h)._M_buckets + lVar15);
              break;
            default:
              uVar6 = 0;
            }
            uVar14 = 0;
            uVar8 = uStack_f0;
            while( true ) {
              uVar13 = uVar8 + uVar14 >> 1;
              if (uVar6 == *(ulong *)(puVar7 + uVar13 * 8)) break;
              if (*(ulong *)(puVar7 + uVar13 * 8) <= uVar6) {
                uVar14 = uVar13 + 1;
                uVar13 = uVar8;
              }
              uVar8 = uVar13;
              if (uVar13 <= uVar14) {
                pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
                Exception::Exception
                          (pEVar9,ValidatorInvalidLength,"Object has invalid index offset");
                __cxa_throw(pEVar9,&Exception::typeinfo,Exception::~Exception);
              }
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 != uStack_f0 + (uStack_f0 == 0));
        }
        else {
          uVar6 = 0;
          do {
            lVar20 = uVar6 << (bVar1 & 0x3f);
            switch(uStack_d8) {
            case 0:
              _Stack_e8._M_head_impl =
                   (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)(ulong)*(byte *)((long)&(puVar17->_M_h)._M_buckets + lVar20);
              break;
            case 1:
              _Stack_e8._M_head_impl =
                   (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)(ulong)*(ushort *)((long)&(puVar17->_M_h)._M_buckets + lVar20);
              break;
            case 2:
              uVar14 = (ulong)*(byte *)((long)&(puVar17->_M_h)._M_buckets + lVar20);
              uVar8 = (ulong)*(ushort *)((long)&(puVar17->_M_h)._M_buckets + lVar20 + 1) << 8;
              goto LAB_001156fa;
            case 3:
              _Stack_e8._M_head_impl =
                   (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)(ulong)*(uint *)((long)&(puVar17->_M_h)._M_buckets + lVar20);
              break;
            case 4:
              uVar2 = *(uint *)((long)&(puVar17->_M_h)._M_buckets + lVar20);
              uVar8 = (ulong)*(byte *)((long)&(puVar17->_M_h)._M_buckets + lVar20 + 4);
              goto LAB_001156f6;
            case 5:
              uVar2 = *(uint *)((long)&(puVar17->_M_h)._M_buckets + lVar20);
              uVar8 = (ulong)*(ushort *)((long)&(puVar17->_M_h)._M_buckets + lVar20 + 4);
LAB_001156f6:
              uVar14 = (ulong)uVar2;
              uVar8 = uVar8 << 0x20;
LAB_001156fa:
              _Stack_e8._M_head_impl =
                   (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)(uVar8 | uVar14);
              break;
            case 6:
              _Stack_e8._M_head_impl =
                   (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)(ulong)CONCAT34(CONCAT12(*(byte *)((long)&(puVar17->_M_h)._M_buckets +
                                                        lVar20 + 6),
                                               *(undefined2 *)
                                                ((long)&(puVar17->_M_h)._M_buckets + lVar20 + 4)),
                                      *(undefined4 *)((long)&(puVar17->_M_h)._M_buckets + lVar20));
              break;
            case 7:
              _Stack_e8._M_head_impl =
                   *(unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     **)((long)&(puVar17->_M_h)._M_buckets + lVar20);
              break;
            default:
              _Stack_e8._M_head_impl =
                   (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)0x0;
            }
            __it = std::
                   _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(&(_Stack_f8._M_head_impl)->_M_h,(key_type *)&_Stack_e8);
            if (__it.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
              pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
              Exception::Exception(pEVar9,ValidatorInvalidLength,"Object has invalid index offset");
              __cxa_throw(pEVar9,&Exception::typeinfo,Exception::~Exception);
            }
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::erase(&(_Stack_f8._M_head_impl)->_M_h,
                    (const_iterator)__it.super__Node_iterator_base<unsigned_long,_false>._M_cur);
            uVar6 = uVar6 + 1;
          } while (uStack_f0 != uVar6);
        }
        std::
        unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ::~unique_ptr((unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                       *)&_Stack_f8);
        if (puStack_108 != (undefined1 *)0x0) {
          operator_delete__(puStack_108);
        }
        return;
      }
    }
LAB_001158be:
    pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
    pcVar12 = "Object index table is out of bounds";
  }
LAB_0011591f:
  Exception::Exception(pEVar9,ValidatorInvalidLength,pcVar12);
  __cxa_throw(pEVar9,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateObject(uint8_t const* ptr, std::size_t length) {
  uint8_t head = *ptr;

  if (head == 0x14U) {
    // compact object
    validateCompactObject(ptr, length);
  } else if (head >= 0x0bU && head <= 0x12U) {
    // regular object
    validateIndexedObject(ptr, length);
  } else if (head == 0x0aU) {
    // empty object. always valid
  }
}